

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fdt.cc
# Opt level: O3

visit_behavior __thiscall
dtc::fdt::node::visit
          (node *this,
          function<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*)> *fn,
          node *parent)

{
  pointer psVar1;
  node *this_00;
  visit_behavior vVar2;
  undefined8 uVar3;
  pointer psVar4;
  node *local_58;
  _Any_data local_50;
  code *local_40;
  
  local_58 = parent;
  if ((fn->super__Function_base)._M_manager == (_Manager_type)0x0) {
    uVar3 = std::__throw_bad_function_call();
    __clang_call_terminate(uVar3);
  }
  vVar2 = (*fn->_M_invoker)((_Any_data *)fn,this,&local_58);
  if (vVar2 != VISIT_CONTINUE) {
    if (vVar2 == VISIT_BREAK) {
      return VISIT_BREAK;
    }
    psVar4 = (this->children).
             super__Vector_base<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar1 = (this->children).
             super__Vector_base<std::shared_ptr<dtc::fdt::node>,_std::allocator<std::shared_ptr<dtc::fdt::node>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar4 != psVar1) {
      do {
        this_00 = (psVar4->super___shared_ptr<dtc::fdt::node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        std::function<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*)>::function
                  ((function<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*)> *)
                   &local_50,fn);
        vVar2 = visit(this_00,(function<dtc::fdt::node::visit_behavior_(dtc::fdt::node_&,_dtc::fdt::node_*)>
                               *)&local_50,this);
        if (local_40 != (code *)0x0) {
          (*local_40)(&local_50,&local_50,__destroy_functor);
        }
        if (vVar2 != VISIT_RECURSE) {
          return vVar2;
        }
        psVar4 = psVar4 + 1;
      } while (psVar4 != psVar1);
    }
  }
  return VISIT_RECURSE;
}

Assistant:

node::visit_behavior
node::visit(std::function<visit_behavior(node&, node*)> fn, node *parent)
{
	visit_behavior behavior;
	behavior = fn(*this, parent);
	if (behavior == VISIT_BREAK)
	{
		return VISIT_BREAK;
	}
	else if (behavior != VISIT_CONTINUE)
	{
		for (auto &&c : children)
		{
			behavior = c->visit(fn, this);
			// Any status other than VISIT_RECURSE stops our execution and
			// bubbles up to our caller.  The caller may then either continue
			// visiting nodes that are siblings to this one or completely halt
			// visiting.
			if (behavior != VISIT_RECURSE)
			{
				return behavior;
			}
		}
	}
	// Continue recursion by default
	return VISIT_RECURSE;
}